

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<float> __thiscall
qclab::dense::operator*(dense *this,SquareMatrix<float> *lhs,SquareMatrix<float> *rhs)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *__s;
  float *pfVar4;
  data_type extraout_RDX;
  long lVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  int64_t k;
  long lVar9;
  ulong __n;
  float fVar10;
  SquareMatrix<float> SVar11;
  
  lVar1 = lhs->size_;
  lVar2 = rhs->size_;
  if (lVar1 != lVar2) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
                 );
  }
  if (lVar1 != 0) {
    __n = 0xffffffffffffffff;
    if ((ulong)(lVar1 * lVar1) >> 0x3e == 0) {
      __n = lVar1 * lVar1 * 4;
    }
    __s = (float *)operator_new__(__n);
    memset(__s,0,__n);
    if (0 < lVar1) {
      pfVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar4 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        lVar7 = 0;
        pfVar6 = pfVar3;
        do {
          fVar10 = __s[lVar5 * lVar1 + lVar7];
          lVar9 = 0;
          pfVar8 = pfVar6;
          do {
            fVar10 = fVar10 + *pfVar8 * pfVar4[lVar9];
            __s[lVar5 * lVar1 + lVar7] = fVar10;
            lVar9 = lVar9 + 1;
            pfVar8 = pfVar8 + lVar1;
          } while (lVar1 != lVar9);
          lVar7 = lVar7 + 1;
          pfVar6 = pfVar6 + 1;
        } while (lVar7 != lVar1);
        lVar5 = lVar5 + 1;
        pfVar4 = pfVar4 + lVar2;
      } while (lVar5 != lVar1);
    }
    pfVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
    if (pfVar3 != (float *)0x0) {
      operator_delete__(pfVar3);
    }
    SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,lhs);
    SVar11.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    SVar11.size_ = (size_type_conflict)this;
    return SVar11;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = float]");
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }